

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hh
# Opt level: O0

void __thiscall tchecker::system::system_t::~system_t(system_t *this)

{
  system_t *this_local;
  
  attributes_t::~attributes_t(&this->_attributes);
  std::__cxx11::string::~string((string *)&this->_name);
  synchronizations_t::~synchronizations_t(&this->super_synchronizations_t);
  processes_t::~processes_t(&this->super_processes_t);
  locs_t::~locs_t(&this->super_locs_t);
  intvars_t::~intvars_t(&this->super_intvars_t);
  events_t::~events_t(&this->super_events_t);
  edges_t::~edges_t(&this->super_edges_t);
  clocks_t::~clocks_t(&this->super_clocks_t);
  return;
}

Assistant:

~system_t() = default;